

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O1

JitProfilingInstr *
IR::JitProfilingInstr::New(OpCode opcode,Opnd *dstOpnd,Opnd *src1Opnd,Opnd *src2Opnd,Func *func)

{
  Func *func_00;
  code *pcVar1;
  bool bVar2;
  byte bVar3;
  JitProfilingInstr *pJVar4;
  undefined4 *puVar5;
  
  pJVar4 = New(opcode,dstOpnd,src1Opnd,func);
  if ((pJVar4->super_Instr).m_src2 != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x18b,"(this->m_src2 == __null)","Trying to overwrite existing src.");
    if (!bVar2) goto LAB_004bb516;
    *puVar5 = 0;
  }
  func_00 = (pJVar4->super_Instr).m_func;
  if (src2Opnd->isDeleted == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x14,"(!isDeleted)","Using deleted operand");
    if (!bVar2) {
LAB_004bb516:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  bVar3 = src2Opnd->field_0xb;
  if ((bVar3 & 2) != 0) {
    src2Opnd = Opnd::Copy(src2Opnd,func_00);
    bVar3 = src2Opnd->field_0xb;
  }
  src2Opnd->field_0xb = bVar3 | 2;
  (pJVar4->super_Instr).m_src2 = src2Opnd;
  return pJVar4;
}

Assistant:

JitProfilingInstr *
JitProfilingInstr::New(Js::OpCode opcode, Opnd *dstOpnd, Opnd *src1Opnd, Opnd *src2Opnd, Func * func)
{
    JitProfilingInstr * profiledInstr = JitProfilingInstr::New(opcode, dstOpnd, src1Opnd, func);
    profiledInstr->SetSrc2(src2Opnd);

    return profiledInstr;
}